

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_input_output(lyout *out,int level,lys_node *node)

{
  int level_00;
  char *pcVar1;
  lys_node_inout *inout;
  lys_node *sub;
  int i;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  pcVar1 = "output";
  if (node->nodetype == LYS_INPUT) {
    pcVar1 = "input";
  }
  yin_print_open(out,level,(char *)0x0,pcVar1,(char *)0x0,(char *)0x0,1);
  level_00 = level + 1;
  if (node->ext_size != '\0') {
    yin_print_extension_instances
              (out,level_00,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size);
  }
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[1]; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_must(out,level_00,node->module,(lys_restr *)(node[1].name + (long)sub._4_4_ * 0x38));
  }
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)*(ushort *)(node->padding + 2);
      sub._4_4_ = sub._4_4_ + 1) {
    yin_print_typedef(out,level_00,node->module,
                      (lys_tpdf *)(*(long *)node->hash + (long)sub._4_4_ * 0x80));
  }
  for (inout = (lys_node_inout *)node->child; inout != (lys_node_inout *)0x0;
      inout = (lys_node_inout *)inout->next) {
    if (inout->parent == node) {
      yin_print_snode(out,level_00,(lys_node *)inout,0x800);
    }
  }
  for (inout = (lys_node_inout *)node->child; inout != (lys_node_inout *)0x0;
      inout = (lys_node_inout *)inout->next) {
    if (inout->parent == node) {
      yin_print_snode(out,level_00,(lys_node *)inout,0x903f);
    }
  }
  pcVar1 = "output";
  if (node->nodetype == LYS_INPUT) {
    pcVar1 = "input";
  }
  yin_print_close(out,level,(char *)0x0,pcVar1,1);
  return;
}

Assistant:

static void
yin_print_input_output(struct lyout *out, int level, const struct lys_node *node)
{
    int i;
    struct lys_node *sub;
    struct lys_node_inout *inout = (struct lys_node_inout *)node;

    yin_print_open(out, level, NULL, inout->nodetype == LYS_INPUT ? "input" : "output", NULL, NULL, 1);
    level++;

    if (inout->ext_size) {
        yin_print_extension_instances(out, level, node->module, LYEXT_SUBSTMT_SELF, 0, inout->ext, inout->ext_size);
    }
    for (i = 0; i < inout->must_size; i++) {
        yin_print_must(out, level, node->module, &inout->must[i]);
    }
    for (i = 0; i < inout->tpdf_size; i++) {
        yin_print_typedef(out, level, node->module, &inout->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_snode(out, level, sub, LYS_GROUPING);
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_snode(out, level, sub, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }
    level--;

    yin_print_close(out, level, NULL, (inout->nodetype == LYS_INPUT ? "input" : "output"), 1);
}